

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O3

void __thiscall
Assimp::MakeLeftHandedProcess::ProcessMaterial(MakeLeftHandedProcess *this,aiMaterial *_mat)

{
  aiMaterialProperty *paVar1;
  int iVar2;
  Logger *this_00;
  uint uVar3;
  ulong uVar4;
  
  if (_mat == (aiMaterial *)0x0) {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"Nullptr to aiMaterial found.");
    return;
  }
  uVar3 = _mat->mNumProperties;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      paVar1 = _mat->mProperties[uVar4];
      iVar2 = strcmp((paVar1->mKey).data,"$tex.mapaxis");
      if (iVar2 == 0) {
        if (paVar1->mDataLength < 0xc) {
          __assert_fail("prop->mDataLength >= sizeof(aiVector3D)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/PostProcessing/ConvertToLHProcess.cpp"
                        ,0xe6,"void Assimp::MakeLeftHandedProcess::ProcessMaterial(aiMaterial *)");
        }
        *(uint *)(paVar1->mData + 8) = *(uint *)(paVar1->mData + 8) ^ 0x80000000;
        uVar3 = _mat->mNumProperties;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  return;
}

Assistant:

void MakeLeftHandedProcess::ProcessMaterial( aiMaterial* _mat) {
    if ( nullptr == _mat ) {
        ASSIMP_LOG_ERROR( "Nullptr to aiMaterial found." );
        return;
    }

    aiMaterial* mat = (aiMaterial*)_mat;
    for (unsigned int a = 0; a < mat->mNumProperties;++a)   {
        aiMaterialProperty* prop = mat->mProperties[a];

        // Mapping axis for UV mappings?
        if (!::strcmp( prop->mKey.data, "$tex.mapaxis"))    {
            ai_assert( prop->mDataLength >= sizeof(aiVector3D)); /* something is wrong with the validation if we end up here */
            aiVector3D* pff = (aiVector3D*)prop->mData;
            pff->z *= -1.f;
        }
    }
}